

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionalPatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalPatternSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::MatchesClauseSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,MatchesClauseSyntax **args_1)

{
  MatchesClauseSyntax *matchesClause;
  ExpressionSyntax *in_RDX;
  ConditionalPatternSyntax *in_RSI;
  BumpAllocator *in_RDI;
  
  matchesClause = (MatchesClauseSyntax *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  slang::syntax::ConditionalPatternSyntax::ConditionalPatternSyntax(in_RSI,in_RDX,matchesClause);
  return (ConditionalPatternSyntax *)matchesClause;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }